

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O2

Matrix * __thiscall
ScalarEstimator::getEstimate(Matrix *__return_storage_ptr__,ScalarEstimator *this,Property *p)

{
  double dVar1;
  StochasticProcess *pSVar2;
  uint uVar3;
  ostream *poVar4;
  Physical *this_00;
  int i;
  long lVar5;
  double dVar6;
  double dVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  Matrix local_528;
  Matrix local_428;
  Physical local_328;
  Physical local_290;
  Physical local_1f8;
  Physical local_160;
  Physical local_c8;
  
  uVar3 = (this->super_Estimator).nSamples;
  if (uVar3 == 0) {
    dVar6 = 1.0;
  }
  else {
    dVar6 = (double)uVar3;
  }
  uVar3 = (this->super_Estimator).nEstimate & *p;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 4) == 0) {
      if ((uVar3 & 8) == 0) {
        if ((uVar3 & 2) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"didn\'t find property");
          std::endl<char,std::char_traits<char>>(poVar4);
          poVar4 = std::operator<<((ostream *)&std::cout,"stored: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,(this->super_Estimator).nEstimate);
          poVar4 = std::operator<<(poVar4,", requested: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,*p);
          std::endl<char,std::char_traits<char>>(poVar4);
          Matrix::Matrix(__return_storage_ptr__);
        }
        else {
          Matrix::Matrix(__return_storage_ptr__,this->nDist,2);
          this_00 = (Physical *)operator_new(0x98);
          Physical::Physical(this_00);
          Physical::Physical(&local_290,this_00);
          Matrix::setPhysical(__return_storage_ptr__,0,&local_290);
          Physical::~Physical(&local_290);
          pSVar2 = (this->super_Estimator).pSource;
          if (pSVar2 != (StochasticProcess *)0x0) {
            Physical::Physical(&local_328,&pSVar2->super_Physical);
            Matrix::setPhysical(__return_storage_ptr__,&local_328);
            Physical::~Physical(&local_328);
            std::__cxx11::string::string
                      ((string *)&local_588,
                       (string *)
                       &(((this->super_Estimator).pSource)->super_Parametric).parametricName);
            std::operator+(&local_568,"probability distribution",&local_588);
            std::operator+(&local_548,&local_568," (");
            std::__cxx11::string::string
                      ((string *)&local_5a8,
                       (string *)
                       &(((this->super_Estimator).pSource)->super_Parametric).parametricType);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_528,&local_548,&local_5a8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_428,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_528,")");
            Matrix::setName(__return_storage_ptr__,(string *)&local_428);
            std::__cxx11::string::~string((string *)&local_428);
            std::__cxx11::string::~string((string *)&local_528);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::__cxx11::string::~string((string *)&local_548);
            std::__cxx11::string::~string((string *)&local_568);
            std::__cxx11::string::~string((string *)&local_588);
          }
          for (lVar5 = 0; lVar5 < this->nDist; lVar5 = lVar5 + 1) {
            i = (int)lVar5;
            dVar7 = this->dDistScale;
            dVar1 = this->dDistOffset;
            Matrix::operator[](&local_528,__return_storage_ptr__,i);
            Matrix::operator[](&local_428,&local_528,0);
            Matrix::operator=(&local_428,(double)i * dVar7 + dVar1);
            Matrix::~Matrix(&local_428);
            Matrix::~Matrix(&local_528);
            dVar7 = this->aDist[lVar5];
            dVar1 = this->dDistScale;
            Matrix::operator[](&local_528,__return_storage_ptr__,i);
            Matrix::operator[](&local_428,&local_528,1);
            Matrix::operator=(&local_428,(dVar7 / dVar6) / dVar1);
            Matrix::~Matrix(&local_428);
            Matrix::~Matrix(&local_528);
          }
        }
      }
      else {
        Matrix::Matrix(__return_storage_ptr__);
        dVar7 = this->dOne;
        pSVar2 = (this->super_Estimator).pSource;
        if (pSVar2 != (StochasticProcess *)0x0) {
          Physical::Physical(&local_1f8,&pSVar2->super_Physical);
          Matrix::setPhysical(__return_storage_ptr__,&local_1f8);
          Physical::~Physical(&local_1f8);
          std::__cxx11::string::string
                    ((string *)&local_588,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricName
                    );
          std::operator+(&local_568,"variance of ",&local_588);
          std::operator+(&local_548,&local_568," (");
          std::__cxx11::string::string
                    ((string *)&local_5a8,
                     (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType
                    );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_528,&local_548,&local_5a8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_428,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_528,")");
          Matrix::setName(__return_storage_ptr__,(string *)&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::__cxx11::string::~string((string *)&local_548);
          std::__cxx11::string::~string((string *)&local_568);
          std::__cxx11::string::~string((string *)&local_588);
        }
        dVar7 = dVar7 / dVar6;
        Matrix::operator=(__return_storage_ptr__,this->dTwo / dVar6 - dVar7 * dVar7);
      }
    }
    else {
      Matrix::Matrix(__return_storage_ptr__);
      pSVar2 = (this->super_Estimator).pSource;
      if (pSVar2 != (StochasticProcess *)0x0) {
        Physical::Physical(&local_160,&pSVar2->super_Physical);
        Matrix::setPhysical(__return_storage_ptr__,&local_160);
        Physical::~Physical(&local_160);
        std::__cxx11::string::string
                  ((string *)&local_588,
                   (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricName);
        std::operator+(&local_568,"mean of ",&local_588);
        std::operator+(&local_548,&local_568," (");
        std::__cxx11::string::string
                  ((string *)&local_5a8,
                   (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_528,&local_548,&local_5a8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_528,")");
        Matrix::setName(__return_storage_ptr__,(string *)&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&local_588);
      }
      Matrix::operator=(__return_storage_ptr__,this->dOne / dVar6);
    }
  }
  else {
    Matrix::Matrix(__return_storage_ptr__);
    pSVar2 = (this->super_Estimator).pSource;
    if (pSVar2 != (StochasticProcess *)0x0) {
      Physical::Physical(&local_c8,&pSVar2->super_Physical);
      Matrix::setPhysical(__return_storage_ptr__,&local_c8);
      Physical::~Physical(&local_c8);
      std::__cxx11::string::string
                ((string *)&local_588,
                 (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricName);
      std::operator+(&local_568,"sample of ",&local_588);
      std::operator+(&local_548,&local_568," (");
      std::__cxx11::string::string
                ((string *)&local_5a8,
                 (string *)&(((this->super_Estimator).pSource)->super_Parametric).parametricType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528
                     ,&local_548,&local_5a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_428
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_528,")");
      Matrix::setName(__return_storage_ptr__,(string *)&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_588);
    }
    Matrix::operator=(__return_storage_ptr__,this->dSample);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix ScalarEstimator::getEstimate(const Property& p)
{
	double samples = nSamples? double(nSamples): 1.0;
	
	if(p & nEstimate & EST_SAMPLE) {
		Matrix a;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("sample of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = dSample;
		return a;
	}
	else if(p & nEstimate & EST_MEAN) {
		Matrix a;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("mean of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = dOne / samples;
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Matrix a;
		double mean = dOne / samples;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("variance of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = (dTwo/samples - mean*mean);
		return a;
	}
	else if(p & nEstimate & EST_DENS) {
		Matrix a(nDist, 2);
		a.setPhysical(0, *(new Physical()));
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("probability distribution"+ pSource->getName() + " (" + pSource->getType() + ")" );
		}
		for(int i=0; i<nDist; i++) {
			a[i][0] = (double(i) * dDistScale) + dDistOffset;
            a[i][1] = aDist[i] / samples / dDistScale;
		}
		return a;
	}
	cout << "didn't find property" << endl;
	cout << "stored: " << nEstimate << ", requested: " << p << endl;
	return Matrix();
}